

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O3

void memory_region_init_ram_ptr_riscv64
               (uc_struct_conflict13 *uc,MemoryRegion_conflict *mr,uint64_t size,void *ptr)

{
  RAMBlock *pRVar1;
  uint64_t uVar2;
  
  memset(mr,0,0xa0);
  mr->uc = (uc_struct_conflict12 *)uc;
  mr->ops = &unassigned_mem_ops_riscv64;
  (mr->subregions).tqh_circ.tql_prev = (QTailQLink *)&mr->subregions;
  uVar2 = 0;
  if (size != 0xffffffffffffffff) {
    uVar2 = size;
  }
  *(uint64_t *)&mr->size = uVar2;
  *(ulong *)((long)&mr->size + 8) = (ulong)(size == 0xffffffffffffffff);
  mr->ram = true;
  mr->terminates = true;
  mr->enabled = true;
  mr->destructor = memory_region_destructor_ram;
  if (ptr != (void *)0x0) {
    pRVar1 = qemu_ram_alloc_from_ptr_riscv64(uc,size,ptr,mr);
    mr->ram_block = pRVar1;
    return;
  }
  __assert_fail("ptr != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/softmmu/memory.c"
                ,0x494,
                "void memory_region_init_ram_ptr_riscv64(struct uc_struct *, MemoryRegion *, uint64_t, void *)"
               );
}

Assistant:

void memory_region_init_ram_ptr(struct uc_struct *uc,
                                MemoryRegion *mr,
                                uint64_t size,
                                void *ptr)
{
    memory_region_init(uc, mr, size);
    mr->ram = true;
    mr->terminates = true;
    mr->destructor = memory_region_destructor_ram;

    /* qemu_ram_alloc_from_ptr cannot fail with ptr != NULL.  */
    assert(ptr != NULL);
    mr->ram_block = qemu_ram_alloc_from_ptr(uc, size, ptr, mr);
}